

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall
BackwardPass::ProcessSymUse(BackwardPass *this,Sym *sym,bool isRegOpndUse,BOOLEAN isNonByteCodeUse)

{
  BasicBlock *pBVar1;
  bool bVar2;
  PropertySym *propertySym;
  StackSym *stackSym;
  
  pBVar1 = this->currentBlock;
  bVar2 = CanDeadStoreInstrForScopeObjRemoval(this,sym);
  if (!bVar2) {
    if (sym->m_kind != SymKindProperty) {
      stackSym = Sym::AsStackSym(sym);
      bVar2 = ProcessStackSymUse(this,stackSym,isNonByteCodeUse);
      return bVar2;
    }
    propertySym = Sym::AsPropertySym(sym);
    ProcessStackSymUse(this,propertySym->m_stackSym,isNonByteCodeUse);
    if (this->isCollectionPass != false) {
      return true;
    }
    bVar2 = DoDeadStoreSlots(this);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                (pBVar1->slotDeadStoreCandidates,(propertySym->super_Sym).m_id);
    }
    if (this->tag == BackwardPhase) {
      bVar2 = ProcessPropertySymUse(this,propertySym);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::ProcessSymUse(Sym * sym, bool isRegOpndUse, BOOLEAN isNonByteCodeUse)
{
    BasicBlock * block = this->currentBlock;

    if (CanDeadStoreInstrForScopeObjRemoval(sym))
    {
        return false;
    }

    if (sym->IsPropertySym())
    {
        PropertySym * propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isNonByteCodeUse);

        if(IsCollectionPass())
        {
            return true;
        }

        if (this->DoDeadStoreSlots())
        {
            block->slotDeadStoreCandidates->Clear(propertySym->m_id);
        }

        if (tag == Js::BackwardPhase)
        {
            // Backward phase tracks liveness of fields to tell GlobOpt where we may need bailout.
            return this->ProcessPropertySymUse(propertySym);
        }
        else
        {
            // Dead-store phase tracks copy propped syms, so it only cares about ByteCodeUses we inserted,
            // not live fields.
            return false;
        }
    }

    return ProcessStackSymUse(sym->AsStackSym(), isNonByteCodeUse);
}